

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimatedLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  string *parmID;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  AnimatedLightNode *this_00;
  runtime_error *this_01;
  long *plVar6;
  size_type *psVar7;
  size_t *in_RDX;
  long lVar8;
  size_type sVar9;
  ulong uVar10;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  lights;
  Vec2f time_range;
  undefined1 local_a8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  size_type local_50;
  XMLLoader *local_48;
  long local_40;
  _Base_ptr local_38;
  
  lVar8 = *(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80);
  if (lVar8 == 0) {
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    sVar9 = lVar8 >> 3;
    local_48 = this;
    local_38 = (_Base_ptr)xml;
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              *)(local_a8 + 0x20),sVar9,(allocator_type *)local_a8);
    local_40 = sVar9 + (sVar9 == 0);
    lVar8 = 0;
    local_50 = sVar9;
    do {
      XML::child((XML *)local_70,*in_RDX);
      loadLight((XMLLoader *)local_a8,(Ref<embree::XML> *)local_38);
      uVar1 = local_a8._0_8_;
      if ((long *)local_a8._0_8_ == (long *)0x0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(local_a8._0_8_,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::LightNode::typeinfo,0);
        plVar6 = (long *)0x0;
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x10))(plVar5);
          plVar6 = plVar5;
        }
      }
      uVar2 = local_a8._32_8_;
      if (*(long **)(local_a8._32_8_ + lVar8 * 8) != (long *)0x0) {
        (**(code **)(**(long **)(local_a8._32_8_ + lVar8 * 8) + 0x18))();
      }
      *(long **)(uVar2 + lVar8 * 8) = plVar6;
      if ((long *)uVar1 != (long *)0x0) {
        (**(code **)(*(long *)uVar1 + 0x18))(uVar1);
      }
      if ((BBox1f)local_70[0]._0_8_ != (BBox1f)0x0) {
        (**(code **)(*(long *)local_70[0]._0_8_ + 0x18))();
      }
      lVar8 = lVar8 + 1;
    } while (local_40 != lVar8);
    iVar3 = (**(code **)(**(long **)local_a8._32_8_ + 0x78))();
    this = local_48;
    sVar9 = local_50;
    if (1 < local_50) {
      uVar10 = 1;
      do {
        iVar4 = (**(code **)(**(long **)(local_a8._32_8_ + uVar10 * 8) + 0x78))();
        if (iVar3 != iVar4) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_((string *)local_70,(ParseLocation *)(*in_RDX + 0x10));
          plVar6 = (long *)std::__cxx11::string::append(local_70[0]._M_local_buf);
          local_a8._0_8_ = *plVar6;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_a8._0_8_ == psVar7) {
            local_a8._16_8_ = *psVar7;
            local_a8._24_8_ = plVar6[3];
            local_a8._0_8_ = local_a8 + 0x10;
          }
          else {
            local_a8._16_8_ = *psVar7;
          }
          local_a8._8_8_ = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::runtime_error::runtime_error(this_01,(string *)local_a8);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar10 = uVar10 + 1;
      } while (sVar9 != uVar10);
    }
    parmID = (string *)*in_RDX;
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"time_range","");
    XML::parm_Vec2f((XML *)local_70,parmID);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_);
    }
    this_00 = (AnimatedLightNode *)operator_new(0x88);
    SceneGraph::AnimatedLightNode::AnimatedLightNode
              (this_00,(vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                        *)(local_a8 + 0x20),(BBox1f)local_70[0]._0_8_);
    (this->path).filename._M_dataplus._M_p = (pointer)this_00;
    (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::~vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               *)(local_a8 + 0x20));
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimatedLight(const Ref<XML>& xml) 
  {
    size_t numLights = xml->size();
    if (numLights == 0)
      return nullptr;

    /* load list of lights */
    std::vector<Ref<SceneGraph::LightNode>> lights(numLights);
    for (size_t i=0; i<numLights; i++) 
      lights[i] = loadLight(xml->child(i)).dynamicCast<SceneGraph::LightNode>();

    /* check that all lights are of same type */
    auto light_type = lights[0]->getType();
    for (size_t i=1; i<numLights; i++) {
      if (light_type != lights[i]->getType())
        THROW_RUNTIME_ERROR(xml->loc.str()+": light types do not match");
    }

    const Vec2f time_range = xml->parm_Vec2f("time_range");
    return new SceneGraph::AnimatedLightNode(std::move(lights),BBox1f(time_range.x,time_range.y));
  }